

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O1

void _run_all<directed_flag_complex_computer::directed_flag_complex_computer_t>
               (bool full,bool in_memory)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  ostream *poVar4;
  logic_error *this;
  long lVar5;
  undefined8 *puVar6;
  string *psVar7;
  byte bVar8;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<unsigned_long> __l_04;
  initializer_list<unsigned_long> __l_05;
  initializer_list<unsigned_long> __l_06;
  initializer_list<unsigned_long> __l_07;
  initializer_list<unsigned_long> __l_08;
  initializer_list<unsigned_long> __l_09;
  initializer_list<unsigned_long> __l_10;
  initializer_list<unsigned_long> __l_11;
  initializer_list<unsigned_long> __l_12;
  initializer_list<unsigned_long> __l_13;
  initializer_list<unsigned_long> __l_14;
  initializer_list<unsigned_long> __l_15;
  initializer_list<unsigned_long> __l_16;
  string file_content;
  string expected_file_content;
  ifstream t;
  allocator_type local_6d9;
  long *local_6d8;
  size_t local_6d0;
  long local_6c8 [2];
  string local_6b8 [2];
  long *local_668;
  size_t local_660;
  long local_658 [2];
  string local_648;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_628;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_610;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_5f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_5e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_5c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_5b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_598;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_580;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_568;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_550;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_538;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_520;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_508;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_4f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_4d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_4c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_4a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_490;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 auStack_150 [36];
  
  bVar8 = 0;
  paVar2 = &local_238.field_2;
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"../../test/d2.flag","");
  local_6b8[0]._M_dataplus._M_p = (pointer)0x1;
  local_6b8[0]._M_string_length = 1;
  __l._M_len = 2;
  __l._M_array = (iterator)local_6b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_490,__l,(allocator_type *)&local_6d8);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"");
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (&local_238,&local_490,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if (local_490.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_490.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_490.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_490.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"../../test/a.flag","");
  local_6b8[0]._M_dataplus._M_p = (pointer)0x1;
  local_6b8[0]._M_string_length = 2;
  local_6b8[0].field_2._M_allocated_capacity = 0;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_6b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_4a8,__l_00,(allocator_type *)&local_6d8);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (&local_238,&local_4a8,&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if (local_4a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4a8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4a8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"../../test/b.flag","");
  local_6b8[0]._M_dataplus._M_p = (pointer)0x1;
  local_6b8[0]._M_string_length = 0;
  local_6b8[0].field_2._M_allocated_capacity = 0;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_6b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_4c0,__l_01,(allocator_type *)&local_6d8);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"");
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (&local_238,&local_4c0,&local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if (local_4c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4c0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4c0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"../../test/c.flag","");
  local_6b8[0]._M_dataplus._M_p = (pointer)0x1;
  local_6b8[0]._M_string_length = 5;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_6b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_4d8,__l_02,(allocator_type *)&local_6d8);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"");
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (&local_238,&local_4d8,&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (local_4d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4d8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4d8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"../../test/d.flag","");
  local_6b8[0]._M_dataplus._M_p = (pointer)0x1;
  local_6b8[0]._M_string_length = 0;
  local_6b8[0].field_2._M_allocated_capacity = 1;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)local_6b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_4f0,__l_03,(allocator_type *)&local_6d8);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"");
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (&local_238,&local_4f0,&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if (local_4f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4f0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4f0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"../../test/e.flag","");
  local_6b8[0].field_2._M_allocated_capacity = 0;
  local_6b8[0].field_2._8_8_ = 0;
  local_6b8[0]._M_dataplus._M_p = (pointer)0x1;
  local_6b8[0]._M_string_length = 0;
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)local_6b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_508,__l_04,(allocator_type *)&local_6d8);
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"");
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (&local_238,&local_508,&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_508.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_508.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_508.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_508.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"../../test/f.flag","");
  local_6b8[0]._M_dataplus._M_p = (pointer)0x1;
  local_6b8[0]._M_string_length = 0;
  local_6b8[0].field_2._M_allocated_capacity = 0;
  __l_05._M_len = 3;
  __l_05._M_array = (iterator)local_6b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_520,__l_05,(allocator_type *)&local_6d8);
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"");
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (&local_238,&local_520,&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if (local_520.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_520.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_520.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_520.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"../../test/d3.flag","");
  local_6b8[0]._M_dataplus._M_p = (pointer)0x1;
  local_6b8[0]._M_string_length = 0;
  local_6b8[0].field_2._M_allocated_capacity = 2;
  __l_06._M_len = 3;
  __l_06._M_array = (iterator)local_6b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_538,__l_06,(allocator_type *)&local_6d8);
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"");
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (&local_238,&local_538,&local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if (local_538.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_538.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_538.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_538.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,"../../test/d3-allzero.flag","");
  local_6b8[0]._M_dataplus._M_p = (pointer)0x1;
  local_6b8[0]._M_string_length = 0;
  local_6b8[0].field_2._M_allocated_capacity = 2;
  __l_07._M_len = 3;
  __l_07._M_array = (iterator)local_6b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_550,__l_07,(allocator_type *)&local_6d8);
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"");
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (&local_238,&local_550,&local_358);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if (local_550.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_550.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_550.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_550.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,"../../test/double-d3.flag","");
  local_6b8[0]._M_dataplus._M_p = (pointer)0x1;
  local_6b8[0]._M_string_length = 0;
  local_6b8[0].field_2._M_allocated_capacity = 5;
  __l_08._M_len = 3;
  __l_08._M_array = (iterator)local_6b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_568,__l_08,(allocator_type *)&local_6d8);
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"");
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (&local_238,&local_568,&local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if (local_568.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_568.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_568.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_568.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,"../../test/double-d3-allzero.flag","");
  local_6b8[0]._M_dataplus._M_p = (pointer)0x1;
  local_6b8[0]._M_string_length = 0;
  local_6b8[0].field_2._M_allocated_capacity = 5;
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)local_6b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_580,__l_09,(allocator_type *)&local_6d8);
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"");
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (&local_238,&local_580,&local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  if (local_580.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_580.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_580.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_580.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"../../test/d4.flag","");
  local_6b8[0].field_2._M_allocated_capacity = 0;
  local_6b8[0].field_2._8_8_ = 9;
  local_6b8[0]._M_dataplus._M_p = (pointer)0x1;
  local_6b8[0]._M_string_length = 0;
  __l_10._M_len = 4;
  __l_10._M_array = (iterator)local_6b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_598,__l_10,(allocator_type *)&local_6d8);
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"");
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (&local_238,&local_598,&local_3b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  if (local_598.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_598.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_598.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_598.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,"../../test/d4-allzero.flag","");
  local_6b8[0].field_2._M_allocated_capacity = 0;
  local_6b8[0].field_2._8_8_ = 9;
  local_6b8[0]._M_dataplus._M_p = (pointer)0x1;
  local_6b8[0]._M_string_length = 0;
  __l_11._M_len = 4;
  __l_11._M_array = (iterator)local_6b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_5b0,__l_11,(allocator_type *)&local_6d8);
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"");
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (&local_238,&local_5b0,&local_3d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  if (local_5b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_5b0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_5b0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_6b8[0].field_2;
  local_6b8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6b8,"../../test/d5.flag","");
  local_238.field_2._M_allocated_capacity = 0;
  local_238.field_2._8_8_ = 0;
  local_238._M_dataplus._M_p = (pointer)0x1;
  local_238._M_string_length = 0;
  local_218 = 0x2c;
  __l_12._M_len = 5;
  __l_12._M_array = (iterator)&local_238;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_5c8,__l_12,(allocator_type *)&local_6d8);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"");
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (local_6b8,&local_5c8,&local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  if (local_5c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_5c8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_5c8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_6b8[0]._M_dataplus._M_p,local_6b8[0].field_2._M_allocated_capacity + 1);
  }
  local_6b8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6b8,"../../test/d7.flag","");
  local_218 = 0;
  uStack_210 = 0;
  local_238.field_2._M_allocated_capacity = 0;
  local_238.field_2._8_8_ = 0;
  local_238._M_dataplus._M_p = (pointer)0x1;
  local_238._M_string_length = 0;
  local_208 = 0x73e;
  __l_13._M_len = 7;
  __l_13._M_array = (iterator)&local_238;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_5e0,__l_13,(allocator_type *)&local_6d8);
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"");
  compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
            (local_6b8,&local_5e0,&local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if (local_5e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_5e0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_5e0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_6b8[0]._M_dataplus._M_p,local_6b8[0].field_2._M_allocated_capacity + 1);
  }
  if (full) {
    remove("../flagser_tmp");
    local_238._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"../../test/a.flag","");
    local_6b8[0]._M_dataplus._M_p = (pointer)0x1;
    local_6b8[0]._M_string_length = 2;
    local_6b8[0].field_2._M_allocated_capacity = 0;
    __l_14._M_len = 3;
    __l_14._M_array = (iterator)local_6b8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_5f8,__l_14,(allocator_type *)&local_6d8);
    local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"../flagser_tmp","");
    compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
              (&local_238,&local_5f8,&local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if (local_5f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_5f8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_5f8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    std::ifstream::ifstream(&local_238,"../flagser_tmp",_S_in);
    local_6d8 = local_6c8;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&local_6d8,
               *(undefined8 *)((long)auStack_150 + *(long *)(local_238._M_dataplus._M_p + -0x18)),
               0xffffffff,0,0xffffffff);
    remove("../flagser_tmp");
    local_668 = local_658;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_668,
               "# persistence intervals in dimension 0\n [0, )\n# persistence intervals in dimension 1\n [0, )\n [0, )\n# persistence intervals in dimension 2\n\nThe remaining homology groups are trivial.\n\n# Euler characteristic: -1\n\n# Betti numbers:\n#\t\tdim H_0 = 1\n#\t\tdim H_1 = 2\n#\t\tdim H_2 = 0\n\n# Cell counts:\n#\t\tdim C_0 = 5\n#\t\tdim C_1 = 7\n#\t\tdim C_2 = 1\n#\t\tdim C_3 = 0\n"
               ,"");
    if (local_6d0 != local_660) {
LAB_00128038:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"The file content differed!",0x1a);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"*** EXPECTED ***",0x10);
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)local_668,local_660);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"*** GOT ***",0xb);
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)local_6d8,local_6d0);
      std::endl<char,std::char_traits<char>>(poVar4);
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"The file content differed.");
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if (local_6d0 != 0) {
      iVar3 = bcmp(local_6d8,local_668,local_6d0);
      if (iVar3 != 0) goto LAB_00128038;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Running extensive tests, this might take a while.",0x31);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    if (in_memory) {
      local_6b8[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6b8,"../../test/medium-test-data.flag","");
      local_648.field_2._M_allocated_capacity = 0x17a;
      local_648.field_2._8_8_ = 0;
      local_648._M_dataplus._M_p = (pointer)0x379d;
      local_648._M_string_length = 0x9a35;
      __l_15._M_len = 4;
      __l_15._M_array = (iterator)&local_648;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_610,__l_15,&local_6d9);
      local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"");
      compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
                (local_6b8,&local_610,&local_458);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
      }
      if (local_610.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_610.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_610.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_610.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_6b8[0]._M_dataplus._M_p,local_6b8[0].field_2._M_allocated_capacity + 1
                       );
      }
      local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"../../test/d10.flag","")
      ;
      puVar6 = &DAT_00143a70;
      psVar7 = local_6b8;
      for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
        (psVar7->_M_dataplus)._M_p = (pointer)*puVar6;
        puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
        psVar7 = (string *)((long)psVar7 + ((ulong)bVar8 * -2 + 1) * 8);
      }
      __l_16._M_len = 10;
      __l_16._M_array = (iterator)local_6b8;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_628,__l_16,&local_6d9);
      local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"");
      compute<directed_flag_complex_computer::directed_flag_complex_computer_t>
                (&local_648,&local_628,&local_478);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != &local_478.field_2) {
        operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
      }
      if (local_628.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_628.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_628.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_628.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_648._M_dataplus._M_p != &local_648.field_2) {
        operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_668 != local_658) {
      operator_delete(local_668,local_658[0] + 1);
    }
    if (local_6d8 != local_6c8) {
      operator_delete(local_6d8,local_6c8[0] + 1);
    }
    std::ifstream::~ifstream(&local_238);
  }
  return;
}

Assistant:

void _run_all(bool full = false, bool in_memory = false) {
	compute<dfc>("../../test/d2.flag", {{1ul, 1ul}});
	compute<dfc>("../../test/a.flag", {{1ul, 2ul, 0ul}});
	compute<dfc>("../../test/b.flag", {{1ul, 0ul, 0ul}});
	compute<dfc>("../../test/c.flag", {{1ul, 5ul}});
	compute<dfc>("../../test/d.flag", {{1ul, 0ul, 1ul}});
	compute<dfc>("../../test/e.flag", {{1ul, 0ul, 0ul, 0ul}});
	compute<dfc>("../../test/f.flag", {{1ul, 0ul, 0ul}});
	compute<dfc>("../../test/d3.flag", {{1ul, 0ul, 2ul}});
	compute<dfc>("../../test/d3-allzero.flag", {{1ul, 0ul, 2ul}});
	compute<dfc>("../../test/double-d3.flag", {{1, 0, 5}});
	compute<dfc>("../../test/double-d3-allzero.flag", {{1, 0, 5}});
	compute<dfc>("../../test/d4.flag", {{1, 0, 0, 9}});
	compute<dfc>("../../test/d4-allzero.flag", {{1, 0, 0, 9}});
	compute<dfc>("../../test/d5.flag", {{1, 0, 0, 0, 44}});
	compute<dfc>("../../test/d7.flag", {{1, 0, 0, 0, 0, 0, 1854}});

	if (full) {
		const auto file_path = "../flagser_tmp";
		std::remove(file_path);
                compute<dfc>("../../test/a.flag", {{1ul, 2ul, 0ul}}, file_path);

		// Check that the file has the right content
		std::ifstream t(file_path);
		std::string file_content((std::istreambuf_iterator<char>(t)), std::istreambuf_iterator<char>());
		std::remove(file_path);

		std::string expected_file_content =
		    "# persistence intervals in dimension 0\n [0, )\n# persistence intervals in dimension 1\n [0, )\n [0, )\n# "
		    "persistence intervals in dimension 2\n\nThe remaining homology groups are trivial.\n\n# Euler "
		    "characteristic: -1\n\n# Betti numbers:\n#\t\tdim H_0 = 1\n#\t\tdim H_1 = 2\n#\t\tdim H_2 = 0\n\n# Cell "
		    "counts:\n#\t\tdim C_0 = 5\n#\t\tdim C_1 = 7\n#\t\tdim C_2 = 1\n#\t\tdim C_3 = 0\n";

		if (file_content != expected_file_content) {
			std::cerr << "The file content differed!" << std::endl;
			std::cerr << std::endl << "*** EXPECTED ***" << std::endl << expected_file_content << std::endl;
			std::cerr << std::endl << "*** GOT ***" << std::endl << file_content << std::endl;
			throw std::logic_error("The file content differed.");
		}

#ifdef NDEBUG
		std::cout << "Running extensive tests, this might take a while." << std::endl;
		if (in_memory) {
		        compute<dfc>("../../test/medium-test-data.flag", {{14237, 39477, 378, 0}});
			compute<dfc>("../../test/d10.flag", {{1, 0, 0, 0, 0, 0, 0, 0, 0, 1334961}});
		}
#else
		std::cout << "Skipping extensive tests." << std::endl;
#endif
	}
}